

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O3

USTATUS __thiscall
FfsParser::parseGuidedSectionHeader
          (FfsParser *this,UByteArray *section,UINT32 localOffset,UModelIndex *parent,
          UModelIndex *index,bool insertIntoTree)

{
  ulong uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  UINT8 subtype;
  char cVar3;
  ushort uVar4;
  uint uVar5;
  TreeModel *pTVar6;
  pointer pcVar7;
  size_t __n;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  _Alloc_hider __n_00;
  bool bVar11;
  byte bVar12;
  int iVar13;
  UINT32 UVar14;
  uLong uVar15;
  ulong uVar16;
  ushort *puVar17;
  ushort uVar18;
  ushort *puVar19;
  USTATUS UVar20;
  EFI_GUID *guid_00;
  UINT8 *ffsSize;
  uint uVar21;
  uint uVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  UByteArray local_1a0;
  UByteArray header;
  UByteArray baGuid;
  CBString additionalInfo;
  UByteArray body;
  _func_int **local_f8;
  UINT8 aUStack_f0 [8];
  TreeModel *local_e8;
  EFI_GUID guid;
  size_type __dnew_1;
  CBString name;
  UModelIndex parentVolumeIndex;
  CBString local_60;
  CBString info;
  
  if (((section->d)._M_string_length & 0xfffffffc) == 0) {
    return 0x14;
  }
  TreeModel::findParentOfType(&parentVolumeIndex,this->model,parent,'A');
  if ((((parentVolumeIndex.r < 0) || (parentVolumeIndex.c < 0)) ||
      (parentVolumeIndex.m == (TreeModel *)0x0)) ||
     (bVar11 = TreeModel::hasEmptyParsingData(this->model,&parentVolumeIndex), bVar11)) {
    ffsSize = (UINT8 *)(section->d)._M_dataplus._M_p;
LAB_0011f041:
    guid._0_8_ = *(undefined8 *)(ffsSize + 4);
    guid.Data4 = *(UINT8 (*) [8])(ffsSize + 0xc);
    puVar17 = (ushort *)(ffsSize + 0x14);
    puVar19 = (ushort *)(ffsSize + 0x16);
    uVar22 = (uint)(section->d)._M_string_length;
    uVar21 = 0x18;
  }
  else {
    TreeModel::parsingData(&baGuid,this->model,&parentVolumeIndex);
    cVar3 = baGuid.d._M_dataplus._M_p[0x19];
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)baGuid.d._M_dataplus._M_p != &baGuid.d.field_2) {
      operator_delete(baGuid.d._M_dataplus._M_p);
    }
    ffsSize = (UINT8 *)(section->d)._M_dataplus._M_p;
    if ((cVar3 != '\x03') || (UVar14 = uint24ToUint32(ffsSize), UVar14 != 0xffffff))
    goto LAB_0011f041;
    uVar22 = (uint)(section->d)._M_string_length;
    if (uVar22 < 0x1c) {
      return 0x14;
    }
    guid._0_8_ = *(undefined8 *)(ffsSize + 8);
    guid.Data4 = *(UINT8 (*) [8])(ffsSize + 0x10);
    puVar17 = (ushort *)(ffsSize + 0x18);
    puVar19 = (ushort *)(ffsSize + 0x1a);
    uVar21 = 0x1c;
  }
  if (uVar22 < uVar21) {
    return 0x14;
  }
  uVar18 = *puVar17;
  uVar22 = (uint)uVar18;
  uVar4 = *puVar19;
  Bstrlib::CBString::CBString(&additionalInfo);
  baGuid.d._M_dataplus._M_p = (pointer)&baGuid.d.field_2;
  header.d._M_dataplus._M_p = (pointer)0x10;
  baGuid.d._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&baGuid,(ulong)&header);
  __n_00 = header.d._M_dataplus;
  baGuid.d.field_2._M_allocated_capacity = (size_type)header.d._M_dataplus._M_p;
  *(undefined8 *)baGuid.d._M_dataplus._M_p = guid._0_8_;
  *(UINT8 (*) [8])(baGuid.d._M_dataplus._M_p + 8) = guid.Data4;
  baGuid.d._M_string_length = (size_type)header.d._M_dataplus._M_p;
  baGuid.d._M_dataplus._M_p[header.d._M_dataplus._M_p] = '\0';
  if ((header.d._M_dataplus._M_p == (pointer)EFI_GUIDED_SECTION_CRC32.d._M_string_length) &&
     ((header.d._M_dataplus._M_p == (pointer)0x0 ||
      (iVar13 = bcmp(baGuid.d._M_dataplus._M_p,EFI_GUIDED_SECTION_CRC32.d._M_dataplus._M_p,
                     (size_t)header.d._M_dataplus._M_p), iVar13 == 0)))) {
    bVar11 = (uVar4 & 2) == 0;
    UVar20 = 0x14;
    if ((uint)(section->d)._M_string_length < uVar21 + 4) goto LAB_0011f826;
    uVar21 = *(uint *)((section->d)._M_dataplus._M_p + uVar21);
    Bstrlib::CBString::CBString((CBString *)&header,"\nChecksum type: CRC32");
    Bstrlib::CBString::operator+=(&additionalInfo,(CBString *)&header);
    Bstrlib::CBString::~CBString((CBString *)&header);
    uVar15 = crc32(0,(uchar *)((section->d)._M_dataplus._M_p + uVar22),
                   (int)(section->d)._M_string_length - uVar22);
    bVar23 = uVar21 != (uint)uVar15;
    if (bVar23) {
      usprintf((CBString *)&header,"\nChecksum: %08Xh, invalid, should be %08Xh",(ulong)uVar21,
               uVar15 & 0xffffffff);
      Bstrlib::CBString::operator+=(&additionalInfo,(CBString *)&header);
      Bstrlib::CBString::~CBString((CBString *)&header);
    }
    else {
      usprintf((CBString *)&header,"\nChecksum: %08Xh, valid",(ulong)uVar21);
      Bstrlib::CBString::operator+=(&additionalInfo,(CBString *)&header);
      Bstrlib::CBString::~CBString((CBString *)&header);
    }
    bVar26 = false;
    bVar8 = false;
    bVar9 = false;
LAB_0011fa05:
    bVar10 = false;
LAB_0011fa0d:
    bVar24 = false;
    bVar12 = 0;
    bVar25 = false;
  }
  else if ((((((__n_00._M_p == (pointer)EFI_GUIDED_SECTION_LZMA.d._M_string_length) &&
              ((__n_00._M_p == (pointer)0x0 ||
               (iVar13 = bcmp(baGuid.d._M_dataplus._M_p,EFI_GUIDED_SECTION_LZMA.d._M_dataplus._M_p,
                              (size_t)__n_00._M_p), iVar13 == 0)))) ||
             ((__n_00._M_p == (pointer)EFI_GUIDED_SECTION_LZMA_HP.d._M_string_length &&
              ((__n_00._M_p == (pointer)0x0 ||
               (iVar13 = bcmp(baGuid.d._M_dataplus._M_p,
                              EFI_GUIDED_SECTION_LZMA_HP.d._M_dataplus._M_p,(size_t)__n_00._M_p),
               iVar13 == 0)))))) ||
            ((__n_00._M_p == (pointer)EFI_GUIDED_SECTION_LZMA_MS.d._M_string_length &&
             ((__n_00._M_p == (pointer)0x0 ||
              (iVar13 = bcmp(baGuid.d._M_dataplus._M_p,EFI_GUIDED_SECTION_LZMA_MS.d._M_dataplus._M_p
                             ,(size_t)__n_00._M_p), iVar13 == 0)))))) ||
           ((__n_00._M_p == (pointer)EFI_GUIDED_SECTION_LZMAF86.d._M_string_length &&
            ((__n_00._M_p == (pointer)0x0 ||
             (iVar13 = bcmp(baGuid.d._M_dataplus._M_p,EFI_GUIDED_SECTION_LZMAF86.d._M_dataplus._M_p,
                            (size_t)__n_00._M_p), iVar13 == 0)))))) ||
          (((__n_00._M_p == (pointer)EFI_GUIDED_SECTION_TIANO.d._M_string_length &&
            ((__n_00._M_p == (pointer)0x0 ||
             (iVar13 = bcmp(baGuid.d._M_dataplus._M_p,EFI_GUIDED_SECTION_TIANO.d._M_dataplus._M_p,
                            (size_t)__n_00._M_p), iVar13 == 0)))) ||
           ((__n_00._M_p == (pointer)EFI_GUIDED_SECTION_GZIP.d._M_string_length &&
            ((__n_00._M_p == (pointer)0x0 ||
             (iVar13 = bcmp(baGuid.d._M_dataplus._M_p,EFI_GUIDED_SECTION_GZIP.d._M_dataplus._M_p,
                            (size_t)__n_00._M_p), iVar13 == 0)))))))) {
    bVar24 = (uVar4 & 1) == 0;
    bVar12 = 0;
LAB_0011f345:
    bVar26 = false;
    bVar11 = false;
    bVar8 = false;
    bVar23 = false;
    bVar9 = false;
    bVar10 = false;
    bVar25 = false;
  }
  else if ((__n_00._M_p == (pointer)EFI_GUIDED_SECTION_ZLIB_AMD.d._M_string_length) &&
          ((__n_00._M_p == (pointer)0x0 ||
           (iVar13 = bcmp(baGuid.d._M_dataplus._M_p,EFI_GUIDED_SECTION_ZLIB_AMD.d._M_dataplus._M_p,
                          (size_t)__n_00._M_p), iVar13 == 0)))) {
    uVar16 = (ulong)(uint)(section->d)._M_string_length;
    uVar1 = (ulong)uVar21 + 0x100;
    UVar20 = 0x14;
    if (uVar16 < uVar1) goto LAB_0011f826;
    bVar24 = (uVar4 & 1) == 0;
    bVar25 = uVar1 + *(uint *)((section->d)._M_dataplus._M_p + (ulong)uVar21 + 0x14) != uVar16;
    uVar22 = uVar22 + 0x100;
    bVar8 = false;
    bVar11 = false;
    bVar26 = false;
    bVar23 = false;
    bVar9 = false;
    bVar10 = false;
    bVar12 = 0;
  }
  else {
    if ((__n_00._M_p != (pointer)EFI_CERT_TYPE_RSA2048_SHA256_GUID.d._M_string_length) ||
       ((__n_00._M_p != (pointer)0x0 &&
        (iVar13 = bcmp(baGuid.d._M_dataplus._M_p,
                       EFI_CERT_TYPE_RSA2048_SHA256_GUID.d._M_dataplus._M_p,(size_t)__n_00._M_p),
        iVar13 != 0)))) {
      if ((__n_00._M_p == (pointer)EFI_FIRMWARE_CONTENTS_SIGNED_GUID.d._M_string_length) &&
         ((__n_00._M_p == (pointer)0x0 ||
          (iVar13 = bcmp(baGuid.d._M_dataplus._M_p,
                         EFI_FIRMWARE_CONTENTS_SIGNED_GUID.d._M_dataplus._M_p,(size_t)__n_00._M_p),
          iVar13 == 0)))) {
        bVar26 = (uVar4 & 1) == 0;
        uVar5 = (uint)(section->d)._M_string_length;
        UVar20 = 0x14;
        if (uVar5 < uVar21 + 8) goto LAB_0011f826;
        pcVar7 = (section->d)._M_dataplus._M_p;
        uVar18 = uVar18 + *(short *)(pcVar7 + uVar21);
        uVar22 = (uint)uVar18;
        if (uVar5 < uVar18) goto LAB_0011f826;
        if (*(short *)(pcVar7 + (ulong)uVar21 + 6) != 0xef1) {
          usprintf((CBString *)&header,"\nCertificate type: unknown (%04Xh)");
          Bstrlib::CBString::operator+=(&additionalInfo,(CBString *)&header);
          Bstrlib::CBString::~CBString((CBString *)&header);
          bVar8 = true;
          bVar11 = false;
          bVar23 = false;
          bVar9 = true;
          goto LAB_0011fa05;
        }
        Bstrlib::CBString::CBString((CBString *)&header,"\nCertificate type: UEFI");
        Bstrlib::CBString::operator+=(&additionalInfo,(CBString *)&header);
        Bstrlib::CBString::~CBString((CBString *)&header);
        pcVar7 = (section->d)._M_dataplus._M_p;
        guid_00 = (EFI_GUID *)(pcVar7 + (ulong)uVar21 + 8);
        header.d._M_dataplus._M_p = (pointer)&header.d.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&header,guid_00,pcVar7 + (ulong)uVar21 + 0x18);
        __n = CONCAT44(header.d._M_string_length._4_4_,(uint)header.d._M_string_length);
        if ((__n == EFI_CERT_TYPE_RSA2048_SHA256_GUID.d._M_string_length) &&
           ((__n == 0 ||
            (iVar13 = bcmp(header.d._M_dataplus._M_p,
                           EFI_CERT_TYPE_RSA2048_SHA256_GUID.d._M_dataplus._M_p,__n), iVar13 == 0)))
           ) {
          Bstrlib::CBString::CBString((CBString *)&body,"\nCertificate subtype: RSA2048/SHA256");
          Bstrlib::CBString::operator+=(&additionalInfo,(CBString *)&body);
          Bstrlib::CBString::~CBString((CBString *)&body);
          bVar10 = false;
        }
        else {
          Bstrlib::CBString::CBString
                    ((CBString *)&local_1a0,"\nCertificate subtype: unknown, GUID ");
          guidToUString(&name,guid_00,true);
          Bstrlib::CBString::operator+((CBString *)&body,(CBString *)&local_1a0,&name);
          Bstrlib::CBString::operator+=(&additionalInfo,(CBString *)&body);
          Bstrlib::CBString::~CBString((CBString *)&body);
          Bstrlib::CBString::~CBString(&name);
          Bstrlib::CBString::~CBString((CBString *)&local_1a0);
          bVar10 = true;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)header.d._M_dataplus._M_p != &header.d.field_2) {
          operator_delete(header.d._M_dataplus._M_p);
        }
        bVar8 = true;
        bVar11 = false;
        bVar23 = false;
        bVar9 = false;
        goto LAB_0011fa0d;
      }
      bVar12 = (byte)uVar4 & 1;
      bVar24 = false;
      goto LAB_0011f345;
    }
    bVar26 = (uVar4 & 1) == 0;
    UVar20 = 0x14;
    if ((uint)(section->d)._M_string_length < uVar21 + 0x210) goto LAB_0011f826;
    Bstrlib::CBString::CBString((CBString *)&header,"\nCertificate type: RSA2048/SHA256");
    Bstrlib::CBString::operator+=(&additionalInfo,(CBString *)&header);
    uVar22 = uVar22 + 0x210;
    Bstrlib::CBString::~CBString((CBString *)&header);
    bVar8 = true;
    bVar11 = false;
    bVar24 = false;
    bVar23 = false;
    bVar9 = false;
    bVar10 = false;
    bVar12 = 0;
    bVar25 = false;
  }
  UByteArray::left(&header,section,uVar22 & 0xffff);
  UByteArray::mid(&body,section,uVar22 & 0xffff,-1);
  guidToUString(&name,&guid,true);
  Bstrlib::CBString::CBString((CBString *)&local_f8,"Section GUID: ");
  guidToUString((CBString *)&__dnew_1,&guid,false);
  Bstrlib::CBString::operator+((CBString *)&local_1a0,(CBString *)&local_f8,(CBString *)&__dnew_1);
  uVar22 = (uint)(section->d)._M_string_length;
  usprintf(&local_60,
           "\nType: %02Xh\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nAttributes: %04Xh"
           ,(ulong)ffsSize[3],(ulong)uVar22,(ulong)uVar22,(ulong)(uint)header.d._M_string_length,
           (ulong)(uint)header.d._M_string_length,(ulong)(uint)body.d._M_string_length,
           (ulong)(uint)body.d._M_string_length,(ulong)uVar4);
  Bstrlib::CBString::operator+(&info,(CBString *)&local_1a0,&local_60);
  Bstrlib::CBString::~CBString(&local_60);
  Bstrlib::CBString::~CBString((CBString *)&local_1a0);
  Bstrlib::CBString::~CBString((CBString *)&__dnew_1);
  Bstrlib::CBString::~CBString((CBString *)&local_f8);
  Bstrlib::CBString::operator+=(&info,&additionalInfo);
  if (insertIntoTree) {
    pTVar6 = this->model;
    subtype = ffsSize[3];
    Bstrlib::CBString::CBString((CBString *)&__dnew_1);
    paVar2 = &local_1a0.d.field_2;
    local_1a0.d._M_string_length = 0;
    local_1a0.d.field_2._M_allocated_capacity =
         local_1a0.d.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_1a0.d._M_dataplus._M_p = (pointer)paVar2;
    TreeModel::addItem((UModelIndex *)&local_f8,pTVar6,localOffset,'C',subtype,&name,
                       (CBString *)&__dnew_1,&info,&header,&body,&local_1a0,Movable,parent,'\0');
    index->m = local_e8;
    *(_func_int ***)index = local_f8;
    index->i = (uint64_t)aUStack_f0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0.d._M_dataplus._M_p != paVar2) {
      operator_delete(local_1a0.d._M_dataplus._M_p);
    }
    Bstrlib::CBString::~CBString((CBString *)&__dnew_1);
    local_f8 = (_func_int **)guid._0_8_;
    aUStack_f0[0] = guid.Data4[0];
    aUStack_f0[1] = guid.Data4[1];
    aUStack_f0[2] = guid.Data4[2];
    aUStack_f0[3] = guid.Data4[3];
    aUStack_f0[4] = guid.Data4[4];
    aUStack_f0[5] = guid.Data4[5];
    aUStack_f0[6] = guid.Data4[6];
    aUStack_f0[7] = guid.Data4[7];
    pTVar6 = this->model;
    __dnew_1 = 0x14;
    local_1a0.d._M_dataplus._M_p = (pointer)paVar2;
    local_1a0.d._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_1a0,(ulong)&__dnew_1);
    local_1a0.d.field_2._M_allocated_capacity = __dnew_1;
    *(_func_int ***)local_1a0.d._M_dataplus._M_p = local_f8;
    *(UINT8 (*) [8])((long)local_1a0.d._M_dataplus._M_p + 8) = aUStack_f0;
    *(undefined4 *)((long)local_1a0.d._M_dataplus._M_p + 0x10) = 0;
    local_1a0.d._M_string_length = __dnew_1;
    local_1a0.d._M_dataplus._M_p[__dnew_1] = '\0';
    TreeModel::setParsingData(pTVar6,index,&local_1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0.d._M_dataplus._M_p != paVar2) {
      operator_delete(local_1a0.d._M_dataplus._M_p);
    }
    if (bVar8) {
      usprintf((CBString *)&local_1a0,
               "%s: GUIDed section signature may become invalid after modification",
               "parseGuidedSectionHeader");
      msg(this,(CBString *)&local_1a0,index);
      Bstrlib::CBString::~CBString((CBString *)&local_1a0);
    }
    if (bVar11) {
      usprintf((CBString *)&local_1a0,"%s: CRC32 GUIDed section without AuthStatusValid attribute",
               "parseGuidedSectionHeader");
      msg(this,(CBString *)&local_1a0,index);
      Bstrlib::CBString::~CBString((CBString *)&local_1a0);
    }
    if (bVar24) {
      usprintf((CBString *)&local_1a0,
               "%s: compressed GUIDed section without ProcessingRequired attribute",
               "parseGuidedSectionHeader");
      msg(this,(CBString *)&local_1a0,index);
      Bstrlib::CBString::~CBString((CBString *)&local_1a0);
    }
    if (bVar26) {
      usprintf((CBString *)&local_1a0,
               "%s: signed GUIDed section without ProcessingRequired attribute",
               "parseGuidedSectionHeader");
      msg(this,(CBString *)&local_1a0,index);
      Bstrlib::CBString::~CBString((CBString *)&local_1a0);
    }
    if (bVar23) {
      usprintf((CBString *)&local_1a0,"%s: CRC32 GUIDed section with invalid checksum",
               "parseGuidedSectionHeader");
      msg(this,(CBString *)&local_1a0,index);
      Bstrlib::CBString::~CBString((CBString *)&local_1a0);
    }
    if (bVar9) {
      usprintf((CBString *)&local_1a0,"%s: signed GUIDed section with unknown certificate type",
               "parseGuidedSectionHeader");
      msg(this,(CBString *)&local_1a0,index);
      Bstrlib::CBString::~CBString((CBString *)&local_1a0);
    }
    if (bVar10) {
      usprintf((CBString *)&local_1a0,"%s: signed GUIDed section with unknown certificate subtype",
               "parseGuidedSectionHeader");
      msg(this,(CBString *)&local_1a0,index);
      Bstrlib::CBString::~CBString((CBString *)&local_1a0);
    }
    if (bVar12 != 0) {
      usprintf((CBString *)&local_1a0,
               "%s: processing required bit set for GUIDed section with unknown GUID",
               "parseGuidedSectionHeader");
      msg(this,(CBString *)&local_1a0,index);
      Bstrlib::CBString::~CBString((CBString *)&local_1a0);
    }
    if (bVar25) {
      usprintf((CBString *)&local_1a0,"%s: AMD Zlib-compressed section with invalid compressed size"
               ,"parseGuidedSectionHeader");
      msg(this,(CBString *)&local_1a0,index);
      Bstrlib::CBString::~CBString((CBString *)&local_1a0);
    }
  }
  Bstrlib::CBString::~CBString(&info);
  Bstrlib::CBString::~CBString(&name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)body.d._M_dataplus._M_p != &body.d.field_2) {
    operator_delete(body.d._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)header.d._M_dataplus._M_p != &header.d.field_2) {
    operator_delete(header.d._M_dataplus._M_p);
  }
  UVar20 = 0;
LAB_0011f826:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)baGuid.d._M_dataplus._M_p != &baGuid.d.field_2) {
    operator_delete(baGuid.d._M_dataplus._M_p);
  }
  Bstrlib::CBString::~CBString(&additionalInfo);
  return UVar20;
}

Assistant:

USTATUS FfsParser::parseGuidedSectionHeader(const UByteArray & section, const UINT32 localOffset, const UModelIndex & parent, UModelIndex & index, const bool insertIntoTree)
{
    // Check sanity
    if ((UINT32)section.size() < sizeof(EFI_COMMON_SECTION_HEADER))
        return U_INVALID_SECTION;
    
    // Obtain required information from parent volume
    UINT8 ffsVersion = 2;
    UModelIndex parentVolumeIndex = model->findParentOfType(parent, Types::Volume);
    if (parentVolumeIndex.isValid() && model->hasEmptyParsingData(parentVolumeIndex) == false) {
        UByteArray data = model->parsingData(parentVolumeIndex);
        const VOLUME_PARSING_DATA* pdata = (const VOLUME_PARSING_DATA*)data.constData();
        ffsVersion = pdata->ffsVersion;
    }
    
    // Obtain header fields
    UINT32 headerSize;
    EFI_GUID guid;
    UINT16 dataOffset;
    UINT16 attributes;
    const EFI_COMMON_SECTION_HEADER* sectionHeader = (const EFI_COMMON_SECTION_HEADER*)(section.constData());
    const EFI_COMMON_SECTION_HEADER2* section2Header = (const EFI_COMMON_SECTION_HEADER2*)(section.constData());
    
    if (ffsVersion == 3 && uint24ToUint32(sectionHeader->Size) == EFI_SECTION2_IS_USED) { // Check for extended header section
        const EFI_GUID_DEFINED_SECTION* guidDefinedSectionHeader = (const EFI_GUID_DEFINED_SECTION*)(section2Header + 1);
        if ((UINT32)section.size() < sizeof(EFI_COMMON_SECTION_HEADER2) + sizeof(EFI_GUID_DEFINED_SECTION))
            return U_INVALID_SECTION;
        headerSize = sizeof(EFI_COMMON_SECTION_HEADER2) + sizeof(EFI_GUID_DEFINED_SECTION);
        guid = guidDefinedSectionHeader->SectionDefinitionGuid;
        dataOffset = guidDefinedSectionHeader->DataOffset;
        attributes = guidDefinedSectionHeader->Attributes;
    }
    else { // Normal section
        const EFI_GUID_DEFINED_SECTION* guidDefinedSectionHeader = (const EFI_GUID_DEFINED_SECTION*)(sectionHeader + 1);
        headerSize = sizeof(EFI_COMMON_SECTION_HEADER) + sizeof(EFI_GUID_DEFINED_SECTION);
        guid = guidDefinedSectionHeader->SectionDefinitionGuid;
        dataOffset = guidDefinedSectionHeader->DataOffset;
        attributes = guidDefinedSectionHeader->Attributes;
    }
    // Check sanity again
    if ((UINT32)section.size() < headerSize)
        return U_INVALID_SECTION;
    
    // Check for special GUIDed sections
    UString additionalInfo;
    UByteArray baGuid((const char*)&guid, sizeof(EFI_GUID));
    bool msgSignedSectionFound = false;
    bool msgNoAuthStatusAttribute = false;
    bool msgNoProcessingRequiredAttributeCompressed = false;
    bool msgNoProcessingRequiredAttributeSigned = false;
    bool msgInvalidCrc = false;
    bool msgUnknownCertType = false;
    bool msgUnknownCertSubtype = false;
    bool msgProcessingRequiredAttributeOnUnknownGuidedSection = false;
    bool msgInvalidCompressedSize = false;
    if (baGuid == EFI_GUIDED_SECTION_CRC32) {
        if ((attributes & EFI_GUIDED_SECTION_AUTH_STATUS_VALID) == 0) { // Check that AuthStatusValid attribute is set on compressed GUIDed sections
            msgNoAuthStatusAttribute = true;
        }
        
        if ((UINT32)section.size() < headerSize + sizeof(UINT32))
            return U_INVALID_SECTION;
        
        UINT32 crc = *(UINT32*)(section.constData() + headerSize);
        additionalInfo += UString("\nChecksum type: CRC32");
        // Calculate CRC32 of section data
        UINT32 calculated = (UINT32)crc32(0, (const UINT8*)section.constData() + dataOffset, (uInt)(section.size() - dataOffset));
        if (crc == calculated) {
            additionalInfo += usprintf("\nChecksum: %08Xh, valid", crc);
        }
        else {
            additionalInfo += usprintf("\nChecksum: %08Xh, invalid, should be %08Xh", crc, calculated);
            msgInvalidCrc = true;
        }
        // No need to change dataOffset here
    }
    else if (baGuid == EFI_GUIDED_SECTION_LZMA
        || baGuid == EFI_GUIDED_SECTION_LZMA_HP
        || baGuid == EFI_GUIDED_SECTION_LZMA_MS
        || baGuid == EFI_GUIDED_SECTION_LZMAF86
        || baGuid == EFI_GUIDED_SECTION_TIANO
        || baGuid == EFI_GUIDED_SECTION_GZIP) {
        if ((attributes & EFI_GUIDED_SECTION_PROCESSING_REQUIRED) == 0) { // Check that ProcessingRequired attribute is set on compressed GUIDed sections
            msgNoProcessingRequiredAttributeCompressed = true;
        }
        // No need to change dataOffset here
    }
    else if (baGuid == EFI_GUIDED_SECTION_ZLIB_AMD) {
        if ((attributes & EFI_GUIDED_SECTION_PROCESSING_REQUIRED) == 0) { // Check that ProcessingRequired attribute is set on compressed GUIDed sections
            msgNoProcessingRequiredAttributeCompressed = true;
        }

        if ((UINT32)section.size() < headerSize + sizeof(EFI_AMD_ZLIB_SECTION_HEADER))
            return U_INVALID_SECTION;

        const EFI_AMD_ZLIB_SECTION_HEADER* amdZlibSectionHeader = (const EFI_AMD_ZLIB_SECTION_HEADER*)(section.constData() + headerSize);

        // Check the compressed size to be sane
        if ((UINT32)section.size() != headerSize + sizeof(EFI_AMD_ZLIB_SECTION_HEADER) + amdZlibSectionHeader->CompressedSize) {
            msgInvalidCompressedSize = true;
        }

        // Adjust dataOffset
        dataOffset += sizeof(EFI_AMD_ZLIB_SECTION_HEADER);
    }
    else if (baGuid == EFI_CERT_TYPE_RSA2048_SHA256_GUID) {
        if ((attributes & EFI_GUIDED_SECTION_PROCESSING_REQUIRED) == 0) { // Check that ProcessingRequired attribute is set on signed GUIDed sections
            msgNoProcessingRequiredAttributeSigned = true;
        }
        
        // Get certificate type and length
        if ((UINT32)section.size() < headerSize + sizeof(EFI_CERT_BLOCK_RSA2048_SHA256))
            return U_INVALID_SECTION;
        
        // Adjust dataOffset
        dataOffset += sizeof(EFI_CERT_BLOCK_RSA2048_SHA256);
        additionalInfo += UString("\nCertificate type: RSA2048/SHA256");
        msgSignedSectionFound = true;
    }
    else if (baGuid == EFI_FIRMWARE_CONTENTS_SIGNED_GUID) {
        if ((attributes & EFI_GUIDED_SECTION_PROCESSING_REQUIRED) == 0) { // Check that ProcessingRequired attribute is set on signed GUIDed sections
            msgNoProcessingRequiredAttributeSigned = true;
        }
        
        // Get certificate type and length
        if ((UINT32)section.size() < headerSize + sizeof(WIN_CERTIFICATE))
            return U_INVALID_SECTION;
        
        const WIN_CERTIFICATE* winCertificate = (const WIN_CERTIFICATE*)(section.constData() + headerSize);
        UINT32 certLength = winCertificate->Length;
        UINT16 certType = winCertificate->CertificateType;
        
        // Adjust dataOffset
        dataOffset += certLength;
        
        // Check section size once again
        if ((UINT32)section.size() < dataOffset)
            return U_INVALID_SECTION;
        
        // Check certificate type
        if (certType == WIN_CERT_TYPE_EFI_GUID) {
            additionalInfo += UString("\nCertificate type: UEFI");
            
            // Get certificate GUID
            const WIN_CERTIFICATE_UEFI_GUID* winCertificateUefiGuid = (const WIN_CERTIFICATE_UEFI_GUID*)(section.constData() + headerSize);
            UByteArray certTypeGuid((const char*)&winCertificateUefiGuid->CertType, sizeof(EFI_GUID));
            
            if (certTypeGuid == EFI_CERT_TYPE_RSA2048_SHA256_GUID) {
                additionalInfo += UString("\nCertificate subtype: RSA2048/SHA256");
            }
            else {
                additionalInfo += UString("\nCertificate subtype: unknown, GUID ") + guidToUString(winCertificateUefiGuid->CertType);
                msgUnknownCertSubtype = true;
            }
        }
        else {
            additionalInfo += usprintf("\nCertificate type: unknown (%04Xh)", certType);
            msgUnknownCertType = true;
        }
        msgSignedSectionFound = true;
    }
    // Check that ProcessingRequired attribute is not set on GUIDed sections with unknown GUID
    else if ((attributes & EFI_GUIDED_SECTION_PROCESSING_REQUIRED) == EFI_GUIDED_SECTION_PROCESSING_REQUIRED) {
        msgProcessingRequiredAttributeOnUnknownGuidedSection = true;
    }
    
    UByteArray header = section.left(dataOffset);
    UByteArray body = section.mid(dataOffset);
    
    // Get info
    UString name = guidToUString(guid);
    UString info = UString("Section GUID: ") + guidToUString(guid, false) +
    usprintf("\nType: %02Xh\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nAttributes: %04Xh",
             sectionHeader->Type,
             (UINT32)section.size(), (UINT32)section.size(),
             (UINT32)header.size(), (UINT32)header.size(),
             (UINT32)body.size(), (UINT32)body.size(),
             attributes);
    
    // Append additional info
    info += additionalInfo;
    
    // Add tree item
    if (insertIntoTree) {
        index = model->addItem(localOffset, Types::Section, sectionHeader->Type, name, UString(), info, header, body, UByteArray(), Movable, parent);
        
        // Set parsing data
        GUIDED_SECTION_PARSING_DATA pdata = {};
        pdata.guid = guid;
        model->setParsingData(index, UByteArray((const char*)&pdata, sizeof(pdata)));
        
        // Show messages
        if (msgSignedSectionFound)
            msg(usprintf("%s: GUIDed section signature may become invalid after modification", __FUNCTION__), index);
        if (msgNoAuthStatusAttribute)
            msg(usprintf("%s: CRC32 GUIDed section without AuthStatusValid attribute", __FUNCTION__), index);
        if (msgNoProcessingRequiredAttributeCompressed)
            msg(usprintf("%s: compressed GUIDed section without ProcessingRequired attribute", __FUNCTION__), index);
        if (msgNoProcessingRequiredAttributeSigned)
            msg(usprintf("%s: signed GUIDed section without ProcessingRequired attribute", __FUNCTION__), index);
        if (msgInvalidCrc)
            msg(usprintf("%s: CRC32 GUIDed section with invalid checksum", __FUNCTION__), index);
        if (msgUnknownCertType)
            msg(usprintf("%s: signed GUIDed section with unknown certificate type", __FUNCTION__), index);
        if (msgUnknownCertSubtype)
            msg(usprintf("%s: signed GUIDed section with unknown certificate subtype", __FUNCTION__), index);
        if (msgProcessingRequiredAttributeOnUnknownGuidedSection)
            msg(usprintf("%s: processing required bit set for GUIDed section with unknown GUID", __FUNCTION__), index);
        if (msgInvalidCompressedSize)
            msg(usprintf("%s: AMD Zlib-compressed section with invalid compressed size", __FUNCTION__), index);
    }
    
    return U_SUCCESS;
}